

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O2

void bench_schnorrsig_verify(void *arg,int iters)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  undefined8 uStack_70;
  secp256k1_xonly_pubkey pk;
  
  uVar4 = 0;
  uVar2 = (ulong)(uint)iters;
  if (iters < 1) {
    uVar2 = uVar4;
  }
  while( true ) {
    if (uVar2 == uVar4) {
      return;
    }
    iVar1 = secp256k1_xonly_pubkey_parse
                      (*arg,&pk,*(undefined8 *)(*(long *)((long)arg + 0x18) + uVar4 * 8));
    if (iVar1 != 1) break;
    iVar1 = secp256k1_schnorrsig_verify
                      (*arg,*(undefined8 *)(*(long *)((long)arg + 0x20) + uVar4 * 8),
                       *(undefined8 *)(*(long *)((long)arg + 0x28) + uVar4 * 8),0x20,&pk);
    if (iVar1 == 0) {
      pcVar3 = 
      "test condition failed: secp256k1_schnorrsig_verify(data->ctx, data->sigs[i], data->msgs[i], MSGLEN, &pk)"
      ;
      uStack_70 = 0x2c;
      goto LAB_00103bd1;
    }
    uVar4 = uVar4 + 1;
  }
  pcVar3 = "test condition failed: secp256k1_xonly_pubkey_parse(data->ctx, &pk, data->pk[i]) == 1";
  uStack_70 = 0x2b;
LAB_00103bd1:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/bench_impl.h"
          ,uStack_70,pcVar3);
  abort();
}

Assistant:

static void bench_schnorrsig_verify(void* arg, int iters) {
    bench_schnorrsig_data *data = (bench_schnorrsig_data *)arg;
    int i;

    for (i = 0; i < iters; i++) {
        secp256k1_xonly_pubkey pk;
        CHECK(secp256k1_xonly_pubkey_parse(data->ctx, &pk, data->pk[i]) == 1);
        CHECK(secp256k1_schnorrsig_verify(data->ctx, data->sigs[i], data->msgs[i], MSGLEN, &pk));
    }
}